

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O0

bool Am_Point_In_All_Owners(Am_Object *in_obj,int x,int y,Am_Object *ref_obj)

{
  bool bVar1;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  undefined4 local_54;
  Am_Object local_50 [3];
  Am_Object local_38;
  Am_Object result;
  Am_Object owner;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  Am_Object *in_obj_local;
  
  Am_Object::Am_Object(&result);
  Am_Object::Am_Object(&local_38);
  Am_Object::Am_Object(local_50,&Am_Screen);
  bVar1 = Am_Object::Is_Instance_Of(in_obj,local_50);
  Am_Object::~Am_Object(local_50);
  if (bVar1) {
    in_obj_local._7_1_ = true;
  }
  else {
    Am_Object::Am_Object(&local_60,ref_obj);
    bVar1 = Am_Object::Is_Part_Of(in_obj,&local_60);
    Am_Object::~Am_Object(&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = Am_Object::operator==(in_obj,ref_obj);
      if (bVar1) {
        in_obj_local._7_1_ = true;
      }
      else {
        Am_Object::operator=(&result,in_obj);
        do {
          Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)&result);
          Am_Object::operator=(&result,&local_68);
          Am_Object::~Am_Object(&local_68);
          Am_Point_In_Obj(&local_70,(int)&result,x,(Am_Object *)(ulong)(uint)y);
          Am_Object::operator=(&local_38,&local_70);
          Am_Object::~Am_Object(&local_70);
          bVar1 = Am_Object::Valid(&local_38);
          if (!bVar1) {
            in_obj_local._7_1_ = false;
            goto LAB_00271bf8;
          }
          bVar1 = Am_Object::operator!=(&result,ref_obj);
        } while (bVar1);
        in_obj_local._7_1_ = true;
      }
    }
    else {
      in_obj_local._7_1_ = false;
    }
  }
LAB_00271bf8:
  local_54 = 1;
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&result);
  return in_obj_local._7_1_;
}

Assistant:

bool
Am_Point_In_All_Owners(const Am_Object &in_obj, int x, int y,
                       const Am_Object &ref_obj)
{
  Am_Object owner, result;
  if (in_obj.Is_Instance_Of(Am_Screen))
    return true;
  if (!in_obj.Is_Part_Of(ref_obj))
    return false;
  // in_obj not actually part of system
  if (in_obj == ref_obj)
    return true;
  owner = in_obj;
  //check all owners all the way up to window
  do {
    owner = owner.Get_Owner();
    //if (!(bool)owner.Get(Am_VISIBLE)) return false;
    // checking visible should be handled in Am_Point_In_Obj
    result = Am_Point_In_Obj(owner, x, y, ref_obj);
    if (!result.Valid())
      return false;
  } while (owner != ref_obj);
  return true; // owner reached top of hierarchy (ref_obj)
}